

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

BCLine debug_frameline(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  BCPos pc_00;
  GCproto *pt;
  BCPos pc;
  cTValue *nextframe_local;
  GCfunc *fn_local;
  lua_State *L_local;
  
  pc_00 = debug_framepc(L,fn,nextframe);
  if (pc_00 == 0xffffffff) {
    L_local._4_4_ = -1;
  }
  else {
    L_local._4_4_ = lj_debug_line((GCproto *)((fn->c).pc.ptr64 - 0x68),pc_00);
  }
  return L_local._4_4_;
}

Assistant:

static BCLine debug_frameline(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    lj_assertL(pc <= pt->sizebc, "PC out of range");
    return lj_debug_line(pt, pc);
  }
  return -1;
}